

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

ostream * operator<<(ostream *out,IMLE *imle_obj)

{
  ostream *this;
  IMLE *in_RSI;
  ostream *in_RDI;
  IMLE *unaff_retaddr;
  ostream *in_stack_ffffffffffffffe8;
  
  this = std::operator<<(in_RDI,"-----------------------  Parameters  ----");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  IMLE::displayParameters(in_RSI,in_stack_ffffffffffffffe8);
  IMLE::modelDisplay(unaff_retaddr,in_RDI);
  return in_RDI;
}

Assistant:

IMLE_CLASS_TEMPLATE
std::ostream &operator<<(std::ostream &out, IMLE_base const &imle_obj)
{
    out << "-----------------------  Parameters  ----" << std::endl;
    imle_obj.displayParameters(out);
    imle_obj.modelDisplay(out);

    return out;
}